

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::TrendGroup> *
metaf::TrendGroup::fromTrendTime(optional<metaf::TrendGroup> *__return_storage_ptr__,string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  uint value;
  int iVar10;
  char cVar11;
  ulong uVar12;
  smatch match;
  undefined2 local_8c;
  undefined1 local_8a;
  string_type local_88;
  ulong local_68;
  ulong local_60;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_58;
  
  if ((fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_),
     iVar4 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_,
               "([FTA][MLT])(\\d\\d\\d\\d)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_);
  }
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_begin._M_current = (char *)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (s->_M_dataplus)._M_p;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + s->_M_string_length),&local_58,
                     &fromTrendTime(std::__cxx11::string_const&)::rgx_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_88,&local_58,2);
    if (local_88._M_string_length == 6) {
      uVar2 = 0;
      lVar6 = 0;
      uVar8 = 0;
      do {
        if ((byte)(local_88._M_dataplus._M_p[lVar6] - 0x3aU) < 0xf6) {
          bVar5 = 0;
          goto LAB_001a5800;
        }
        uVar8 = (uint)(byte)(local_88._M_dataplus._M_p[lVar6] - 0x30) + uVar8 * 10;
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != 2);
      bVar5 = 1;
      uVar2 = uVar8;
LAB_001a5800:
      lVar6 = 2;
      iVar4 = 0;
      do {
        bVar7 = local_88._M_dataplus._M_p[lVar6] - 0x30;
        if (9 < bVar7) {
          iVar4 = 0;
          break;
        }
        iVar4 = (uint)bVar7 + iVar4 * 10;
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != 4);
      iVar10 = 0;
      lVar6 = 4;
      do {
        if ((byte)(local_88._M_dataplus._M_p[lVar6] - 0x3aU) < 0xf6) goto LAB_001a5881;
        iVar10 = (uint)(byte)(local_88._M_dataplus._M_p[lVar6] - 0x30) + iVar10 * 10;
        lVar6 = lVar6 + 1;
      } while ((int)lVar6 != 6);
      if ((bVar7 < 10 & bVar5) == 0) goto LAB_001a5881;
      uVar12 = (ulong)bVar5 << 0x20;
      uVar9 = (ulong)uVar2;
      cVar11 = '\x01';
    }
    else {
      if (local_88._M_string_length == 4) {
        lVar6 = 0;
        iVar4 = 0;
        do {
          bVar5 = local_88._M_dataplus._M_p[lVar6] - 0x3a;
          if (bVar5 < 0xf6) {
            iVar4 = 0;
            break;
          }
          iVar4 = (uint)(byte)(local_88._M_dataplus._M_p[lVar6] - 0x30) + iVar4 * 10;
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 != 2);
        iVar10 = 0;
        lVar6 = 2;
        do {
          if ((byte)(local_88._M_dataplus._M_p[lVar6] - 0x3aU) < 0xf6) goto LAB_001a5881;
          iVar10 = (uint)(byte)(local_88._M_dataplus._M_p[lVar6] - 0x30) + iVar10 * 10;
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 != 4);
        if (0xf5 < bVar5) {
          cVar11 = '\x01';
          uVar9 = 0;
          uVar12 = 0;
          goto LAB_001a588d;
        }
      }
LAB_001a5881:
      local_8a = 0;
      local_8c = 0;
      uVar9 = 0;
      uVar12 = 0;
      iVar4 = 0;
      iVar10 = 0;
      cVar11 = '\0';
    }
LAB_001a588d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (cVar11 != '\0') {
      local_68 = uVar9;
      local_60 = uVar12;
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_88,&local_58,1);
      iVar3 = std::__cxx11::string::compare((char *)&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 == 0) {
        (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.t = FROM;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 4) = 0;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0xc) =
             local_60 | local_68;
        *(int *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload +
                0x14) = iVar4;
        *(int *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload +
                0x18) = iVar10;
        *(char *)((long)&(__return_storage_ptr__->
                         super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                         super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c) = cVar11
        ;
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1d) =
             local_8c;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1f) =
             local_8a;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
LAB_001a5a56:
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
      }
      else {
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_88,&local_58,1);
        iVar3 = std::__cxx11::string::compare((char *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 == 0) {
          (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.t = UNTIL;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 4) = 0;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c) = 0
          ;
          *(ulong *)((long)&(__return_storage_ptr__->
                            super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                            super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) =
               local_60 | local_68;
          *(int *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) = iVar4
          ;
          *(int *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x2c) =
               iVar10;
          *(char *)((long)&(__return_storage_ptr__->
                           super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) =
               cVar11;
          *(undefined2 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x31) =
               local_8c;
          *(undefined1 *)
           ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                   _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x33) =
               local_8a;
          goto LAB_001a5a56;
        }
        std::__cxx11::
        match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::str(&local_88,&local_58,1);
        iVar3 = std::__cxx11::string::compare((char *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 != 0) goto LAB_001a599b;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x47) =
             local_8a;
        *(undefined2 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x45) =
             local_8c;
        (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::TrendGroup>._M_payload._M_value.t = AT;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 4) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x1c) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
        *(ulong *)((long)&(__return_storage_ptr__->
                          super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                          super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x34) =
             local_60 | local_68;
        *(int *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload +
                0x3c) = iVar4;
        *(int *)((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>
                        )._M_payload.super__Optional_payload_base<metaf::TrendGroup>._M_payload +
                0x40) = iVar10;
        *(char *)((long)&(__return_storage_ptr__->
                         super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
                         super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = cVar11
        ;
      }
      (__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::TrendGroup>._M_engaged = true;
      goto LAB_001a59b1;
    }
  }
LAB_001a599b:
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x3c) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x44) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x38) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x20) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x10) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 0x18) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::TrendGroup>._M_payload = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::TrendGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::TrendGroup>._M_payload + 8) = 0;
LAB_001a59b1:
  if (local_58.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<TrendGroup> TrendGroup::fromTrendTime(const std::string & s) {
	static const std::optional<TrendGroup> notRecognised;
	static const std::regex rgx("([FTA][MLT])(\\d\\d\\d\\d)");
	static const auto matchType = 1, matchTime = 2;
	std::smatch match;
	if (!regex_match(s, match, rgx)) return notRecognised;
	const auto time = MetafTime::fromStringDDHHMM(match.str(matchTime));
	if (!time.has_value()) return notRecognised;
	TrendGroup result;
	if (match.str(matchType) == "FM") {
		result.t = Type::FROM;
		result.tFrom = time;
		return result;
	}
	if (match.str(matchType) == "TL") {
		result.t = Type::UNTIL;
		result.tTill = time;
		return result;
	}
	if (match.str(matchType) == "AT") {
		result.t = Type::AT;
		result.tAt = time;
		return result;
	}
	return notRecognised;
}